

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Struct.h
# Opt level: O1

void __thiscall soul::Structure::Structure(Structure *this,Structure *param_1)

{
  pointer pcVar1;
  size_t sVar2;
  undefined4 uVar3;
  __alloc_node_gen_t __alloc_node_gen;
  _AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_true>_>_>
  local_30;
  
  (this->super_RefCountedObject).refCount = 0;
  this->backlinkToASTObject = param_1->backlinkToASTObject;
  this->activeUseFlag = param_1->activeUseFlag;
  ArrayWithPreallocation<soul::Structure::Member,_8UL>::ArrayWithPreallocation
            (&this->members,&param_1->members);
  (this->name)._M_dataplus._M_p = (pointer)&(this->name).field_2;
  pcVar1 = (param_1->name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->name,pcVar1,pcVar1 + (param_1->name)._M_string_length);
  local_30._M_h = (__hashtable_alloc *)&this->memberIndexMap;
  (this->memberIndexMap)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->memberIndexMap)._M_h._M_bucket_count = (param_1->memberIndexMap)._M_h._M_bucket_count;
  (this->memberIndexMap)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->memberIndexMap)._M_h._M_element_count = (param_1->memberIndexMap)._M_h._M_element_count;
  uVar3 = *(undefined4 *)&(param_1->memberIndexMap)._M_h._M_rehash_policy.field_0x4;
  sVar2 = (param_1->memberIndexMap)._M_h._M_rehash_policy._M_next_resize;
  (this->memberIndexMap)._M_h._M_rehash_policy._M_max_load_factor =
       (param_1->memberIndexMap)._M_h._M_rehash_policy._M_max_load_factor;
  *(undefined4 *)&(this->memberIndexMap)._M_h._M_rehash_policy.field_0x4 = uVar3;
  (this->memberIndexMap)._M_h._M_rehash_policy._M_next_resize = sVar2;
  (this->memberIndexMap)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  std::
  _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
  ::
  _M_assign<std::_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<std::pair<std::__cxx11::string_const,unsigned_long>,true>>>>
            ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,unsigned_long>,std::allocator<std::pair<std::__cxx11::string_const,unsigned_long>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
              *)local_30._M_h,&(param_1->memberIndexMap)._M_h,&local_30);
  return;
}

Assistant:

Structure (const Structure&) = default;